

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O1

self * __thiscall sznet::LogStream::operator<<(LogStream *this,char *str)

{
  char *pcVar1;
  size_t __n;
  char **ppcVar2;
  
  if (str == (char *)0x0) {
    pcVar1 = (this->m_buffer).m_cur;
    if ((uint)(((int)this + 0xfa8) - (int)pcVar1) < 7) {
      return this;
    }
    builtin_strncpy(pcVar1,"(null)",6);
    __n = 6;
  }
  else {
    __n = strlen(str);
    pcVar1 = (this->m_buffer).m_cur;
    if ((ulong)(long)(((int)this + 0xfa8) - (int)pcVar1) <= __n) {
      return this;
    }
    memcpy(pcVar1,str,__n);
  }
  ppcVar2 = &(this->m_buffer).m_cur;
  *ppcVar2 = *ppcVar2 + __n;
  return this;
}

Assistant:

self& operator<<(const char* str)
	{
		if (str)
		{
			m_buffer.append(str, strlen(str));
		}
		else
		{
			m_buffer.append("(null)", 6);
		}
		return *this;
	}